

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * ra_get_container(roaring_array_t *ra,uint16_t x,uint8_t *typecode)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (0 < ra->size) {
    iVar3 = ra->size + -1;
    iVar4 = 0;
    do {
      uVar2 = (uint)(iVar3 + iVar4) >> 1;
      uVar1 = *(ushort *)((long)ra->keys + (ulong)(iVar3 + iVar4 & 0xfffffffe));
      if (uVar1 < x) {
        iVar4 = uVar2 + 1;
      }
      else {
        if (uVar1 <= x) {
          *typecode = ra->typecodes[uVar2];
          return ra->containers[uVar2];
        }
        iVar3 = uVar2 - 1;
      }
    } while (iVar4 <= iVar3);
  }
  return (container_t *)0x0;
}

Assistant:

container_t *ra_get_container(
    roaring_array_t *ra, uint16_t x, uint8_t *typecode
){
    int i = binarySearch(ra->keys, (int32_t)ra->size, x);
    if (i < 0) return NULL;
    *typecode = ra->typecodes[i];
    return ra->containers[i];
}